

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::reduce_number_length(string *unit_string,char detect)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type ploc_3;
  size_type ploc_2;
  bool valid_1;
  size_type dloc_1;
  size_type ploc_1;
  size_type ploc;
  bool valid;
  size_type dloc;
  size_type nloc;
  size_type zloc;
  size_t indexingloc;
  string *detseq;
  string *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined1 *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar7;
  size_type local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined1 local_1d [29];
  
  local_1d[0x14] = in_SIL;
  local_1d._21_8_ = in_RDI;
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    in_stack_ffffffffffffff78 = local_1d + 0x13;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(allocator<char> *)in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)(local_1d + 0x13));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    in_stack_ffffffffffffff70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(allocator<char> *)in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  if (local_1d[0x14] == '0') {
    __pos = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  else {
    __pos = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  }
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
  do {
    if (local_38 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      return;
    }
    local_40 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_not_of(in_stack_ffffffffffffff88,
                                   (char)((ulong)in_stack_ffffffffffffff80 >> 0x38),
                                   (size_type)in_stack_ffffffffffffff78);
    if (local_40 == 0xffffffffffffffff) {
      if (local_1d[0x14] != '9') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d._21_8_);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff70,(char)((ulong)__pos >> 0x38),0x783e35);
        in_stack_ffffffffffffff98 = pbVar6;
        if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0xffffffffffffffff) {
          in_stack_ffffffffffffff97 = 1;
          pbVar1 = pbVar6;
          if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&local_38[-1].field_2 + 0xfU)) {
            in_stack_ffffffffffffff97 = 0;
            do {
              do {
              } while (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0);
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pbVar6[-1].field_2 + 0xf);
              pvVar4 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffff70,(size_type)__pos);
              bVar2 = isDigitCharacter(*pvVar4);
              if (!bVar2) goto LAB_00783f29;
              pvVar4 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffff70,(size_type)__pos);
            } while (*pvVar4 == '0');
            in_stack_ffffffffffffff97 = 1;
          }
          else {
            do {
              pbVar6 = in_stack_ffffffffffffff88;
              in_stack_ffffffffffffff80 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + 1);
              if (local_38 <= in_stack_ffffffffffffff80) goto LAB_00783f29;
              pvVar4 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffff70,(size_type)__pos);
              bVar2 = isDigitCharacter(*pvVar4);
              in_stack_ffffffffffffff88 = pbVar6;
              pbVar1 = in_stack_ffffffffffffff80;
            } while (bVar2);
            in_stack_ffffffffffffff97 = 0;
          }
LAB_00783f29:
          in_stack_ffffffffffffff88 = pbVar6;
          if ((in_stack_ffffffffffffff97 & 1) != 0) {
            shorten_number(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
            in_stack_ffffffffffffff88 = pbVar6;
          }
        }
      }
    }
    else {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffff70,(size_type)__pos);
      if (*pvVar4 != '.') {
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff70,(size_type)__pos);
        bVar2 = isDigitCharacter(*pvVar4);
        if (bVar2) {
          sVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d._21_8_);
          if (local_40 + 1 < sVar5) {
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_ffffffffffffff70,(size_type)__pos);
            bVar2 = isDigitCharacter(*pvVar4);
            if (!bVar2) goto LAB_00783c15;
          }
        }
        else {
LAB_00783c15:
          pvVar4 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_ffffffffffffff70,(size_type)__pos);
          bVar2 = isDigitCharacter(*pvVar4);
          if (bVar2) {
            local_40 = local_40 + 1;
          }
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff70,(char)((ulong)__pos >> 0x38),0x783cb7);
          if ((pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xffffffffffffffff) && (0xc < local_40 - (long)pbVar6)) {
            bVar7 = 1;
            if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&local_38[-1].field_2 + 0xfU)) {
              bVar7 = 0;
              do {
                if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) goto LAB_00783dbf;
                pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pbVar6[-1].field_2 + 0xf);
                pvVar4 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_ffffffffffffff70,(size_type)__pos);
                bVar2 = isDigitCharacter(*pvVar4);
                if (!bVar2) goto LAB_00783dbf;
                pvVar4 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_ffffffffffffff70,(size_type)__pos);
              } while (*pvVar4 == '0');
              bVar7 = 1;
            }
            else {
              do {
                in_stack_ffffffffffffffa0 = (string *)((long)&(pbVar6->_M_dataplus)._M_p + 1);
                if (local_38 <= in_stack_ffffffffffffffa0) goto LAB_00783dbf;
                pvVar4 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_ffffffffffffff70,(size_type)__pos);
                bVar2 = isDigitCharacter(*pvVar4);
                pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffa0;
              } while (bVar2);
              bVar7 = 0;
            }
LAB_00783dbf:
            if ((bVar7 & 1) != 0) {
              shorten_number(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
            }
          }
        }
      }
    }
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
  } while( true );
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}